

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O1

void __thiscall
cmExtraCodeLiteGenerator::CreateProjectFile
          (cmExtraCodeLiteGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs)

{
  cmMakefile *this_00;
  char *pcVar1;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string projectName;
  string outputDir;
  string local_a0;
  long *local_80 [2];
  long local_70 [2];
  long *local_60;
  long local_58;
  long local_50 [2];
  long *local_40;
  long local_38;
  long local_30 [2];
  
  this_00 = (*(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start)->Makefile;
  pcVar1 = cmMakefile::GetCurrentBinaryDirectory(this_00);
  std::__cxx11::string::string((string *)&local_40,pcVar1,(allocator *)&local_60);
  std::__cxx11::string::string
            ((string *)&local_60,(this_00->ProjectName)._M_dataplus._M_p,(allocator *)&local_a0);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a0,local_40,local_38 + (long)local_40);
  std::__cxx11::string::append((char *)&local_a0);
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char*>((string *)local_80,local_60,local_58 + (long)local_60);
  std::__cxx11::string::append((char *)local_80);
  std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80[0]);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  CreateNewProjectFile(this,lgs,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

void cmExtraCodeLiteGenerator::CreateProjectFile(
  const std::vector<cmLocalGenerator*>& lgs)
{
  const cmMakefile* mf    = lgs[0]->GetMakefile();
  std::string outputDir   = mf->GetCurrentBinaryDirectory();
  std::string projectName = mf->GetProjectName();
  std::string filename    = outputDir + "/";

  filename += projectName + ".project";
  this->CreateNewProjectFile(lgs, filename);
}